

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemNumerify(Mem *pMem)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  long local_10;
  
  uVar3 = (uint)pMem->flags;
  if ((pMem->flags & 0x2d) != 0) goto LAB_00145885;
  uVar3 = sqlite3AtoF(pMem->z,(double *)pMem,pMem->n,pMem->enc);
  if ((uVar3 < 2) && (iVar4 = sqlite3Atoi64(pMem->z,&local_10,pMem->n,pMem->enc), iVar4 < 2)) {
LAB_00145871:
    (pMem->u).i = local_10;
    uVar3 = 4;
  }
  else {
    dVar1 = (pMem->u).r;
    local_10 = (long)dVar1;
    if (((dVar1 == 0.0) && (!NAN(dVar1))) ||
       ((uVar3 = 8, 0xffe < (uint)((ulong)(local_10 + -0x8000000000000) >> 0x34) &&
        (dVar1 == (double)local_10)))) goto LAB_00145871;
  }
  uVar2._0_2_ = pMem->flags;
  uVar2._2_1_ = pMem->enc;
  uVar2._3_1_ = pMem->eSubtype;
  uVar3 = uVar3 | uVar2 & 0xfffff240;
LAB_00145885:
  pMem->flags = (u16)(uVar3 & 0xfbed);
  return uVar3 & 0xfbed;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemNumerify(Mem *pMem){
  assert( pMem!=0 );
  testcase( pMem->flags & MEM_Int );
  testcase( pMem->flags & MEM_Real );
  testcase( pMem->flags & MEM_IntReal );
  testcase( pMem->flags & MEM_Null );
  if( (pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal|MEM_Null))==0 ){
    int rc;
    sqlite3_int64 ix;
    assert( (pMem->flags & (MEM_Blob|MEM_Str))!=0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
    rc = sqlite3AtoF(pMem->z, &pMem->u.r, pMem->n, pMem->enc);
    if( ((rc==0 || rc==1) && sqlite3Atoi64(pMem->z, &ix, pMem->n, pMem->enc)<=1)
     || sqlite3RealSameAsInt(pMem->u.r, (ix = (i64)pMem->u.r))
    ){
      pMem->u.i = ix;
      MemSetTypeFlag(pMem, MEM_Int);
    }else{
      MemSetTypeFlag(pMem, MEM_Real);
    }
  }
  assert( (pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal|MEM_Null))!=0 );
  pMem->flags &= ~(MEM_Str|MEM_Blob|MEM_Zero);
  return SQLITE_OK;
}